

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall Diligent::DeviceContextGLImpl::Draw(DeviceContextGLImpl *this,DrawAttribs *Attribs)

{
  undefined8 in_RAX;
  GLenum GlTopology;
  GLenum local_14;
  
  local_14 = (GLenum)((ulong)in_RAX >> 0x20);
  DeviceContextBase<Diligent::EngineGLImplTraits>::Draw
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PrepareForDraw(this,Attribs->Flags,false,&local_14);
  if ((Attribs->NumVertices != 0) && (Attribs->NumInstances != 0)) {
    DrawArrays(local_14,Attribs->NumVertices,Attribs->NumInstances,Attribs->StartVertexLocation,
               Attribs->FirstInstanceLocation);
  }
  GLContextState::SetPendingMemoryBarriers
            (&this->m_ContextState,this->m_CommittedResourcesTentativeBarriers);
  this->m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;
  return;
}

Assistant:

void DeviceContextGLImpl::Draw(const DrawAttribs& Attribs)
{
    TDeviceContextBase::Draw(Attribs, 0);

    GLenum GlTopology;
    PrepareForDraw(Attribs.Flags, false, GlTopology);

    if (Attribs.NumVertices > 0 && Attribs.NumInstances > 0)
    {
        DrawArrays(GlTopology,
                   Attribs.NumVertices,
                   Attribs.NumInstances,
                   Attribs.StartVertexLocation,
                   Attribs.FirstInstanceLocation);
    }

    PostDraw();
}